

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ostream *poVar1;
  Ast pre_eval;
  Ast post_eval;
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  file;
  Parse_ast parse;
  char local_61;
  Ast local_60;
  Ast local_50;
  istream *local_40;
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  local_38;
  
  get_program((int)&local_40,(char **)(ulong)(uint)argc);
  lambda::parse_from((Parse_ast *)&local_38,local_40);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"parse: ",7);
  poVar1 = lambda::operator<<((ostream *)&std::cout,(Parse_ast *)&local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\n",2);
  lambda::reduce((lambda *)&local_60,(Parse_ast *)&local_38);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"typed: ",7);
  poVar1 = lambda::operator<<((ostream *)&std::cout,&local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\n",2);
  lambda::eval((lambda *)&local_50,&local_60);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"eval\'d: ",8);
  poVar1 = lambda::operator<<((ostream *)&std::cout,&local_50);
  local_61 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_61,1);
  if (local_50.underlying_.
      super___shared_ptr<const_std::variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.underlying_.
               super___shared_ptr<const_std::variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_60.underlying_.
      super___shared_ptr<const_std::variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.underlying_.
               super___shared_ptr<const_std::variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  std::__detail::__variant::
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  ::~_Variant_storage(&local_38);
  (**(code **)(*(long *)local_40 + 8))(local_40);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  auto file = get_program(argc, argv);

  auto parse = [&] {
    try {
      return lambda::parse_from(*file);
    } catch (lambda::Parse_error const& e) {
      ublib::failwith(e);
    }
  }();

  std::cout << "parse: " << parse << "\n\n";

  auto const pre_eval = lambda::reduce(parse);
  std::cout << "typed: " << pre_eval << "\n\n";   

  auto const post_eval = eval(pre_eval);
  std::cout << "eval'd: " << post_eval << '\n';
}